

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parser::AddFastScannedRegExpNode(Parser *this,ParseNodePtr pnode)

{
  RealCount *pRVar1;
  DListNodeBase<ParseNode_*> *pDVar2;
  anon_union_8_3_7fb8a913_for_next aVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  NodeDList *pNVar7;
  anon_union_8_3_7fb8a913_for_next *paVar8;
  
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3061,"(!IsBackgroundParser())","!IsBackgroundParser()");
    if (!bVar5) goto LAB_00e71607;
    *puVar6 = 0;
  }
  if (this->m_doingFastScan == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3062,"(m_doingFastScan)","m_doingFastScan");
    if (!bVar5) {
LAB_00e71607:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pNVar7 = this->fastScannedRegExpNodes;
  if (pNVar7 == (NodeDList *)0x0) {
    pNVar7 = (NodeDList *)new<Memory::ArenaAllocator>(0x20,&this->m_nodeAllocator,0x364470);
    (pNVar7->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.next.node =
         (DListNode<ParseNode_*> *)pNVar7;
    (pNVar7->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.prev.list =
         (DListBase<ParseNode_*,_RealCount> *)pNVar7;
    (pNVar7->super_DListBase<ParseNode_*,_RealCount>).super_RealCount.count = 0;
    pNVar7->allocator = &this->m_nodeAllocator;
    this->fastScannedRegExpNodes = pNVar7;
  }
  else {
    this = (Parser *)pNVar7->allocator;
  }
  paVar8 = (anon_union_8_3_7fb8a913_for_next *)
           new<Memory::ArenaAllocator>(0x18,&this->m_nodeAllocator,0x364470);
  paVar8[2].base = (DListNodeBase<ParseNode_*> *)pnode;
  pDVar2 = (pNVar7->super_DListBase<ParseNode_*,_RealCount>).super_DListNodeBase<ParseNode_*>.prev.
           base;
  paVar8[1].base = pDVar2;
  aVar3 = pDVar2->next;
  paVar8->base = (DListNodeBase<ParseNode_*> *)aVar3;
  *(anon_union_8_3_7fb8a913_for_next **)((long)aVar3 + 8) = paVar8;
  (pDVar2->next).base = (DListNodeBase<ParseNode_*> *)paVar8;
  pRVar1 = &(pNVar7->super_DListBase<ParseNode_*,_RealCount>).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void Parser::AddFastScannedRegExpNode(ParseNodePtr const pnode)
{
    Assert(!IsBackgroundParser());
    Assert(m_doingFastScan);

    if (fastScannedRegExpNodes == nullptr)
    {
        fastScannedRegExpNodes = Anew(&m_nodeAllocator, NodeDList, &m_nodeAllocator);
    }
    fastScannedRegExpNodes->Append(pnode);
}